

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeCloseStatement(Vdbe *p,int eOp)

{
  int op;
  int in_ESI;
  long *in_RDI;
  Btree *pBt;
  int rc2;
  int iSavepoint;
  int i;
  int rc;
  sqlite3 *db;
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  undefined4 in_stack_fffffffffffffff0;
  
  lVar4 = *in_RDI;
  iVar3 = 0;
  if ((*(int *)(lVar4 + 0x310) != 0) && (*(int *)((long)in_RDI + 0x9c) != 0)) {
    op = *(int *)((long)in_RDI + 0x9c) + -1;
    for (iVar2 = 0; iVar2 < *(int *)(lVar4 + 0x28); iVar2 = iVar2 + 1) {
      iVar1 = 0;
      if (*(long *)(*(long *)(lVar4 + 0x20) + (long)iVar2 * 0x20 + 8) != 0) {
        if (in_ESI == 2) {
          iVar1 = sqlite3BtreeSavepoint((Btree *)CONCAT44(iVar3,iVar2),op,0);
        }
        if (iVar1 == 0) {
          iVar1 = sqlite3BtreeSavepoint((Btree *)CONCAT44(iVar3,iVar2),op,0);
        }
        if (iVar3 == 0) {
          iVar3 = iVar1;
        }
      }
    }
    *(int *)(lVar4 + 0x310) = *(int *)(lVar4 + 0x310) + -1;
    *(undefined4 *)((long)in_RDI + 0x9c) = 0;
    if (iVar3 == 0) {
      if (in_ESI == 2) {
        iVar3 = sqlite3VtabSavepoint
                          ((sqlite3 *)CONCAT44(2,in_stack_fffffffffffffff0),
                           (int)((ulong)lVar4 >> 0x20),(int)lVar4);
      }
      if (iVar3 == 0) {
        iVar3 = sqlite3VtabSavepoint
                          ((sqlite3 *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                           (int)((ulong)lVar4 >> 0x20),(int)lVar4);
      }
    }
    if (in_ESI == 2) {
      *(long *)(lVar4 + 0x318) = in_RDI[0x1a];
      *(long *)(lVar4 + 800) = in_RDI[0x1b];
    }
  }
  return iVar3;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeCloseStatement(Vdbe *p, int eOp){
  sqlite3 *const db = p->db;
  int rc = SQLITE_OK;

  /* If p->iStatement is greater than zero, then this Vdbe opened a 
  ** statement transaction that should be closed here. The only exception
  ** is that an IO error may have occurred, causing an emergency rollback.
  ** In this case (db->nStatement==0), and there is nothing to do.
  */
  if( db->nStatement && p->iStatement ){
    int i;
    const int iSavepoint = p->iStatement-1;

    assert( eOp==SAVEPOINT_ROLLBACK || eOp==SAVEPOINT_RELEASE);
    assert( db->nStatement>0 );
    assert( p->iStatement==(db->nStatement+db->nSavepoint) );

    for(i=0; i<db->nDb; i++){ 
      int rc2 = SQLITE_OK;
      Btree *pBt = db->aDb[i].pBt;
      if( pBt ){
        if( eOp==SAVEPOINT_ROLLBACK ){
          rc2 = sqlite3BtreeSavepoint(pBt, SAVEPOINT_ROLLBACK, iSavepoint);
        }
        if( rc2==SQLITE_OK ){
          rc2 = sqlite3BtreeSavepoint(pBt, SAVEPOINT_RELEASE, iSavepoint);
        }
        if( rc==SQLITE_OK ){
          rc = rc2;
        }
      }
    }
    db->nStatement--;
    p->iStatement = 0;

    if( rc==SQLITE_OK ){
      if( eOp==SAVEPOINT_ROLLBACK ){
        rc = sqlite3VtabSavepoint(db, SAVEPOINT_ROLLBACK, iSavepoint);
      }
      if( rc==SQLITE_OK ){
        rc = sqlite3VtabSavepoint(db, SAVEPOINT_RELEASE, iSavepoint);
      }
    }

    /* If the statement transaction is being rolled back, also restore the 
    ** database handles deferred constraint counter to the value it had when 
    ** the statement transaction was opened.  */
    if( eOp==SAVEPOINT_ROLLBACK ){
      db->nDeferredCons = p->nStmtDefCons;
      db->nDeferredImmCons = p->nStmtDefImmCons;
    }
  }
  return rc;
}